

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

void string_handler(void *data,char *s,int len)

{
  void *pvVar1;
  size_t __n;
  long current_length;
  char *char_data;
  parser_info *info;
  int len_local;
  char *s_local;
  void *data_local;
  
  if (*(int *)((long)data + 0x50) < 1) {
    if (*(long *)(*data + 0x10) == 0) {
      pvVar1 = malloc((long)(len + 1));
      *(void **)(*data + 0x10) = pvVar1;
      if (*(long *)(*data + 0x10) == 0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",(long)len + 1,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                       ,0xf06);
        abort_parser((parser_info *)data);
      }
      else {
        memcpy(*(void **)(*data + 0x10),s,(long)len);
        *(undefined1 *)(*(long *)(*data + 0x10) + (long)len) = 0;
      }
    }
    else {
      __n = strlen(*(char **)(*data + 0x10));
      pvVar1 = malloc(__n + (long)len + 1);
      if (pvVar1 == (void *)0x0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__n + (long)len + 1
                       ,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                       ,0xf16);
        abort_parser((parser_info *)data);
      }
      else {
        memcpy(pvVar1,*(void **)(*data + 0x10),__n);
        memcpy((void *)((long)pvVar1 + __n),s,(long)len);
        *(undefined1 *)((long)pvVar1 + __n + (long)len) = 0;
        free(*(void **)(*data + 0x10));
        *(void **)(*data + 0x10) = pvVar1;
      }
    }
  }
  return;
}

Assistant:

static void XMLCALL string_handler(void *data, const char *s, int len)
{
    parser_info *info = (parser_info *)data;

    if (info->unparsed_depth > 0)
    {
        return;
    }

    if (info->node->char_data == NULL)
    {
        info->node->char_data = malloc(len + 1);
        if (info->node->char_data == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)len + 1, __FILE__, __LINE__);
            abort_parser(info);
            return;
        }
        memcpy(info->node->char_data, s, len);
        info->node->char_data[len] = '\0';
    }
    else
    {
        char *char_data;
        long current_length = (long)strlen(info->node->char_data);

        char_data = malloc(current_length + len + 1);
        if (char_data == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           current_length + len + 1, __FILE__, __LINE__);
            abort_parser(info);
            return;
        }
        memcpy(char_data, info->node->char_data, current_length);
        memcpy(&char_data[current_length], s, len);
        char_data[current_length + len] = '\0';
        free(info->node->char_data);
        info->node->char_data = char_data;
    }
}